

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

bool duckdb::Timestamp::TryFromDatetime(date_t date,dtime_t time,timestamp_t *result)

{
  bool bVar1;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>((long)date.days,86400000000,&result->value)
  ;
  if ((bVar1) &&
     (bVar1 = TryAddOperator::Operation<long,long,long>(result->value,time.micros,&result->value),
     bVar1)) {
    return result->value != -0x7fffffffffffffff && result->value != 0x7fffffffffffffff;
  }
  return false;
}

Assistant:

bool Timestamp::TryFromDatetime(date_t date, dtime_t time, timestamp_t &result) {
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(date.days, Interval::MICROS_PER_DAY, result.value)) {
		return false;
	}
	if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(result.value, time.micros, result.value)) {
		return false;
	}
	return Timestamp::IsFinite(result);
}